

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,
          typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *typed_option)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  undefined1 *puVar1;
  iterator __begin0;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  __x = (typed_option->m_value).
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  if (__x != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,__x);
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puVar1 = &this->field_0x18;
      puVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," --",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(typed_option->super_base_option).m_name._M_dataplus._M_p,
                   (typed_option->super_base_option).m_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
        puVar2 = puVar2 + 1;
      } while (puVar2 != local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>>& typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }